

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestComment::Run(ParserTestComment *this)

{
  int iVar1;
  Test *this_00;
  bool condition;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse(&this->super_ParserTest,"# this is a comment\nfoo = not # a comment\n");
  this_00 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"foo",&local_61);
    BindingEnv::LookupVariable(&local_60,&(this->super_ParserTest).state.bindings_,&local_40);
    condition = std::operator==("not # a comment",&local_60);
    testing::Test::Check
              (this_00,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0xd8,"\"not # a comment\" == state.bindings_.LookupVariable(\"foo\")");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Comment) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"# this is a comment\n"
"foo = not # a comment\n"));
  EXPECT_EQ("not # a comment", state.bindings_.LookupVariable("foo"));
}